

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# border.cpp
# Opt level: O2

void __thiscall ftxui::anon_unknown_0::BorderPixel::Render(BorderPixel *this,Screen *screen)

{
  Pixel *pPVar1;
  Pixel *pPVar2;
  int iVar3;
  int iVar4;
  
  (**(code **)((long)((((this->super_Node).children_.
                        super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                     _vptr_Node + 0x20))();
  iVar4 = (this->super_Node).box_.x_min;
  if ((iVar4 < (this->super_Node).box_.x_max) &&
     (iVar3 = (this->super_Node).box_.y_min, iVar3 < (this->super_Node).box_.y_max)) {
    pPVar1 = &this->pixel_;
    pPVar2 = Screen::PixelAt(screen,iVar4,iVar3);
    Pixel::operator=(pPVar2,pPVar1);
    pPVar2 = Screen::PixelAt(screen,(this->super_Node).box_.x_max,(this->super_Node).box_.y_min);
    Pixel::operator=(pPVar2,pPVar1);
    pPVar2 = Screen::PixelAt(screen,(this->super_Node).box_.x_min,(this->super_Node).box_.y_max);
    Pixel::operator=(pPVar2,pPVar1);
    pPVar2 = Screen::PixelAt(screen,(this->super_Node).box_.x_max,(this->super_Node).box_.y_max);
    Pixel::operator=(pPVar2,pPVar1);
    iVar4 = (this->super_Node).box_.x_min;
    while( true ) {
      iVar4 = iVar4 + 1;
      iVar3 = (this->super_Node).box_.y_min;
      if ((this->super_Node).box_.x_max <= iVar4) break;
      pPVar2 = Screen::PixelAt(screen,iVar4,iVar3);
      Pixel::operator=(pPVar2,pPVar1);
      pPVar2 = Screen::PixelAt(screen,iVar4,(this->super_Node).box_.y_max);
      Pixel::operator=(pPVar2,pPVar1);
    }
    while (iVar3 = iVar3 + 1, iVar3 < (this->super_Node).box_.y_max) {
      pPVar2 = Screen::PixelAt(screen,(this->super_Node).box_.x_min,iVar3);
      Pixel::operator=(pPVar2,pPVar1);
      pPVar2 = Screen::PixelAt(screen,(this->super_Node).box_.x_max,iVar3);
      Pixel::operator=(pPVar2,pPVar1);
    }
  }
  return;
}

Assistant:

void Render(Screen& screen) override {
    // Draw content.
    children_[0]->Render(screen);

    // Draw the border.
    if (box_.x_min >= box_.x_max || box_.y_min >= box_.y_max) {
      return;
    }

    screen.PixelAt(box_.x_min, box_.y_min) = pixel_;
    screen.PixelAt(box_.x_max, box_.y_min) = pixel_;
    screen.PixelAt(box_.x_min, box_.y_max) = pixel_;
    screen.PixelAt(box_.x_max, box_.y_max) = pixel_;

    for (int x = box_.x_min + 1; x < box_.x_max; ++x) {
      screen.PixelAt(x, box_.y_min) = pixel_;
      screen.PixelAt(x, box_.y_max) = pixel_;
    }
    for (int y = box_.y_min + 1; y < box_.y_max; ++y) {
      screen.PixelAt(box_.x_min, y) = pixel_;
      screen.PixelAt(box_.x_max, y) = pixel_;
    }
  }